

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

common_chat_params *
common_chat_templates_apply
          (common_chat_params *__return_storage_ptr__,common_chat_templates *tmpls,
          common_chat_templates_inputs *inputs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  chat_template *pcVar4;
  pointer pbVar5;
  common_chat_templates_inputs *pcVar6;
  common_chat_templates *pcVar7;
  common_chat_params *pcVar8;
  int iVar9;
  common_log *log;
  long lVar10;
  runtime_error *this;
  uint uVar11;
  size_type __n;
  ulong uVar12;
  pointer pcVar13;
  long lVar14;
  common_chat_msg_content_part *part;
  pointer pcVar15;
  long lVar16;
  undefined1 auVar17 [16];
  string content;
  vector<llama_chat_message,_std::allocator<llama_chat_message>_> chat;
  vector<char,_std::allocator<char>_> buf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  contents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  vector<llama_chat_message,_std::allocator<llama_chat_message>_> local_d8;
  vector<char,_std::allocator<char>_> local_b8;
  common_chat_templates_inputs *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  common_chat_templates *local_80;
  common_chat_params *local_78;
  pointer local_70;
  data local_68;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  if (tmpls == (common_chat_templates *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/chat.cpp"
               ,0x6c5,"GGML_ASSERT(%s) failed","tmpls != nullptr");
  }
  if (inputs->use_jinja == true) {
    common_chat_templates_apply_jinja(__return_storage_ptr__,tmpls,inputs);
  }
  else {
    __n = 0;
    local_d8.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (llama_chat_message *)0x0;
    local_d8.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl.
    super__Vector_impl_data._M_finish = (llama_chat_message *)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pcVar13 = (inputs->messages).
              super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_70 = (inputs->messages).
               super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
               super__Vector_impl_data._M_finish;
    pcVar6 = inputs;
    pcVar7 = tmpls;
    pcVar8 = __return_storage_ptr__;
    if (pcVar13 != local_70) {
      do {
        local_78 = pcVar8;
        local_80 = pcVar7;
        local_a0 = pcVar6;
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        pcVar2 = (pcVar13->content)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,pcVar2,pcVar2 + (pcVar13->content)._M_string_length);
        pcVar3 = (pcVar13->content_parts).
                 super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pcVar15 = (pcVar13->content_parts).
                       super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                       ._M_impl.super__Vector_impl_data._M_start; pcVar15 != pcVar3;
            pcVar15 = pcVar15 + 1) {
          iVar9 = std::__cxx11::string::compare((char *)pcVar15);
          if (iVar9 == 0) {
            if ((char *)local_f8._M_string_length != (char *)0x0) {
              std::__cxx11::string::append((char *)&local_f8);
            }
            std::__cxx11::string::_M_append
                      ((char *)&local_f8,(ulong)(pcVar15->text)._M_dataplus._M_p);
          }
          else if (-1 < common_log_verbosity_thold) {
            log = common_log_main();
            common_log_add(log,GGML_LOG_LEVEL_WARN,"Ignoring non-text content part: %s\n",
                           (pcVar15->type)._M_dataplus._M_p);
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                   &local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        pcVar13 = pcVar13 + 1;
        pcVar6 = local_a0;
        pcVar7 = local_80;
        pcVar8 = local_78;
      } while (pcVar13 != local_70);
      __n = 0;
      __return_storage_ptr__ = local_78;
      inputs = local_a0;
      tmpls = local_80;
      if (local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar16 = 8;
        lVar14 = 8;
        uVar12 = 0;
        do {
          pbVar5 = local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar13 = (local_a0->messages).
                    super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_f8._M_dataplus._M_p = *(pointer *)((long)pcVar13 + lVar16 + -8);
          local_f8._M_string_length =
               *(long *)((long)local_98.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8);
          if (local_d8.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::
            _M_realloc_insert<llama_chat_message>
                      (&local_d8,
                       (iterator)
                       local_d8.
                       super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(llama_chat_message *)&local_f8);
          }
          else {
            (local_d8.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
             _M_impl.super__Vector_impl_data._M_finish)->role = local_f8._M_dataplus._M_p;
            (local_d8.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
             _M_impl.super__Vector_impl_data._M_finish)->content = (char *)local_f8._M_string_length
            ;
            local_d8.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_d8.
                 super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          lVar10 = *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar14) +
                   *(long *)((long)&(pcVar13->role)._M_dataplus + lVar16);
          auVar17._8_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar17._0_8_ = lVar10;
          auVar17._12_4_ = 0x45300000;
          uVar11 = (uint)(((auVar17._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) * 1.25 +
                         (double)(int)__n);
          __n = (size_type)uVar11;
          uVar12 = uVar12 + 1;
          lVar14 = lVar14 + 0x20;
          lVar16 = lVar16 + 0xd0;
        } while (uVar12 < (ulong)((long)local_98.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_98.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
        __n = (size_type)(int)uVar11;
        __return_storage_ptr__ = local_78;
        inputs = local_a0;
        tmpls = local_80;
      }
    }
    std::vector<char,_std::allocator<char>_>::vector(&local_b8,__n,(allocator_type *)&local_f8);
    pcVar4 = (tmpls->template_default)._M_t.
             super___uniq_ptr_impl<minja::chat_template,_std::default_delete<minja::chat_template>_>
             ._M_t.
             super__Tuple_impl<0UL,_minja::chat_template_*,_std::default_delete<minja::chat_template>_>
             .super__Head_base<0UL,_minja::chat_template_*,_false>._M_head_impl;
    uVar11 = llama_chat_apply_template
                       ((pcVar4->source_)._M_dataplus._M_p,
                        local_d8.
                        super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_d8.
                              super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4,
                        inputs->add_generation_prompt,
                        local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (int)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                        (int)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    if ((int)uVar11 < 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"this custom template is not supported");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((ulong)(CONCAT44(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish._4_4_,
                         (int)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish) -
               (long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start) < (ulong)uVar11) {
      std::vector<char,_std::allocator<char>_>::resize(&local_b8,(ulong)uVar11);
      uVar11 = llama_chat_apply_template
                         ((pcVar4->source_)._M_dataplus._M_p,
                          local_d8.
                          super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.
                                super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_d8.
                                super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4,
                          inputs->add_generation_prompt,
                          local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (int)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                          (int)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start);
    }
    __return_storage_ptr__->format = COMMON_CHAT_FORMAT_CONTENT_ONLY;
    (__return_storage_ptr__->prompt)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->prompt).field_2;
    (__return_storage_ptr__->prompt)._M_string_length = 0;
    (__return_storage_ptr__->prompt).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->grammar)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->grammar).field_2;
    (__return_storage_ptr__->grammar)._M_string_length = 0;
    (__return_storage_ptr__->grammar).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->grammar_lazy = false;
    (__return_storage_ptr__->grammar_triggers).
    super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->grammar_triggers).
    super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->grammar_triggers).
    super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->preserved_tokens).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->preserved_tokens).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->preserved_tokens).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->additional_stops).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->additional_stops).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->additional_stops).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + (int)uVar11);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->prompt,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((inputs->json_schema)._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->grammar);
    }
    else {
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_48 = (code *)0x0;
      uStack_40 = 0;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::parse<std::__cxx11::string_const&>
                ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)&local_68,&inputs->json_schema,(parser_callback_t *)&local_58,true,false);
      json_schema_to_grammar(&local_f8,(json *)&local_68,false);
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->grammar,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_68,false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_68);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
    }
    if (local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    if (local_d8.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.
                      super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.
                            super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

common_chat_params common_chat_templates_apply(
    const struct common_chat_templates * tmpls,
    const struct common_chat_templates_inputs & inputs)
{
    GGML_ASSERT(tmpls != nullptr);
    return inputs.use_jinja
        ? common_chat_templates_apply_jinja(tmpls, inputs)
        : common_chat_templates_apply_legacy(tmpls, inputs);
}